

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuImage.cpp
# Opt level: O2

int createBoxConstraints
              (vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               *coverMatrix,int header)

{
  ulong uVar1;
  ulong uVar2;
  ulong __n;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int rowDelta;
  long lVar9;
  reference rVar10;
  
  __n = (ulong)(uint)header;
  lVar6 = 0;
  for (uVar2 = 1; uVar2 < 10; uVar2 = uVar2 + 3) {
    lVar5 = lVar6;
    for (uVar1 = 1; uVar1 < 10; uVar1 = uVar1 + 3) {
      __n = (ulong)(int)__n;
      lVar4 = lVar5;
      for (lVar8 = 1; lVar8 != 10; lVar8 = lVar8 + 1) {
        lVar3 = lVar4;
        for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
          for (lVar7 = 0; lVar7 != 0x438; lVar7 = lVar7 + 0x168) {
            rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)
                                ((long)&(((coverMatrix->
                                          super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start)->
                                        super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                        super__Bvector_impl_data + lVar7 + lVar3),__n);
            *rVar10._M_p = *rVar10._M_p | rVar10._M_mask;
          }
          lVar3 = lVar3 + 0xca8;
        }
        __n = __n + 1;
        lVar4 = lVar4 + 0x28;
      }
      lVar5 = lVar5 + 0x438;
    }
    lVar6 = lVar6 + 0x25f8;
  }
  return (int)__n;
}

Assistant:

int createBoxConstraints(vector<vector<bool> > &coverMatrix, int header){
    for (int row = COVER_START_INDEX; row <= SIZE; row += BOX_SIZE) {
      for (int column = COVER_START_INDEX; column <= SIZE; column += BOX_SIZE) {
        for (int n = COVER_START_INDEX; n <= SIZE; n++, header++) {
          for (int rowDelta = 0; rowDelta < BOX_SIZE; rowDelta++) {
            for (int columnDelta = 0; columnDelta < BOX_SIZE; columnDelta++) {
              int index = indexInCoverMatrix(row + rowDelta, column + columnDelta, n);
              //matrix[index][header] = 1;
              coverMatrix[index][header] = true;
            }
          }
        }
      }
    }
    return header;
}